

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::anon_unknown_1::average<unsigned_short>
               (unsigned_short *src,int sstride,int uw,int vw,unsigned_short *dst,int nchan)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  void *__s;
  undefined8 uStack_40;
  float local_38;
  int local_34;
  
  lVar5 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar5);
  local_38 = (float)vw;
  local_34 = uw;
  *(undefined8 *)((long)&uStack_40 + lVar5) = 0x11740f;
  memset(__s,0,(long)nchan << 2);
  iVar3 = (sstride / 2) * (int)local_38;
  if (iVar3 != 0) {
    puVar1 = src + iVar3;
    iVar3 = nchan * local_34;
    do {
      if (iVar3 != 0) {
        puVar2 = src + iVar3;
        do {
          if (0 < nchan) {
            lVar5 = 0;
            do {
              *(float *)((long)__s + lVar5 * 2) =
                   (float)*(ushort *)((long)src + lVar5) + *(float *)((long)__s + lVar5 * 2);
              lVar5 = lVar5 + 2;
            } while ((ulong)(uint)nchan * 2 != lVar5);
            src = (unsigned_short *)((long)src + lVar5);
          }
        } while (src != puVar2);
      }
      src = src + (sstride / 2 - iVar3);
    } while (src != puVar1);
  }
  if (0 < nchan) {
    uVar4 = 0;
    do {
      dst[uVar4] = (unsigned_short)
                   (int)(*(float *)((long)__s + uVar4 * 4) *
                        (1.0 / (float)((int)local_38 * local_34)));
      uVar4 = uVar4 + 1;
    } while ((uint)nchan != uVar4);
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }